

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,Domain *aValue,
          vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          *aRet)

{
  _Invoker_type aRet_00;
  Status SVar1;
  string local_c0;
  function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> local_a0;
  Domain local_70;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> pred;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  *aRet_local;
  Domain *aValue_local;
  PersistentStorageJson *this_local;
  
  pred._M_invoker = (_Invoker_type)aRet;
  std::function<bool(ot::commissioner::persistent_storage::Domain_const&)>::
  function<ot::commissioner::persistent_storage::PersistentStorageJson::Lookup(ot::commissioner::persistent_storage::Domain_const&,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>&)::__0,void>
            ((function<bool(ot::commissioner::persistent_storage::Domain_const&)> *)local_40,
             &local_41);
  Domain::Domain(&local_70,aValue);
  std::function<bool(ot::commissioner::persistent_storage::Domain_const&)>::operator=
            ((function<bool(ot::commissioner::persistent_storage::Domain_const&)> *)local_40,
             (anon_class_40_1_4b93a6ce *)&local_70);
  Lookup(ot::commissioner::persistent_storage::Domain_const&,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>&)
  ::$_1::~__1((__1 *)&local_70);
  std::function<bool_(const_ot::commissioner::persistent_storage::Domain_&)>::function
            (&local_a0,
             (function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *)local_40);
  aRet_00 = pred._M_invoker;
  std::__cxx11::string::string((string *)&local_c0,(string *)JSON_DOM_abi_cxx11_);
  SVar1 = LookupPred<ot::commissioner::persistent_storage::Domain>
                    (this,&local_a0,
                     (vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      *)aRet_00,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::function<bool_(const_ot::commissioner::persistent_storage::Domain_&)>::~function(&local_a0);
  std::function<bool_(const_ot::commissioner::persistent_storage::Domain_&)>::~function
            ((function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *)local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(Domain const &aValue, std::vector<Domain> &aRet)
{
    std::function<bool(Domain const &)> pred = [](Domain const &) { return true; };

    pred = [aValue](Domain const &el) {
        bool aRet = (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
                    (aValue.mName.empty() || (aValue.mName == el.mName));
        return aRet;
    };

    return LookupPred<Domain>(pred, aRet, JSON_DOM);
}